

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateAdjustBaseSlots
          (Lowerer *this,Instr *instrInsert,RegOpnd *baseOpnd,JITTypeHolder initialType,
          JITTypeHolder finalType)

{
  FunctionJITRuntimeInfo **this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  JITType *pJVar5;
  JITTypeHandler *pJVar6;
  JITTypeHandler *pJVar7;
  undefined4 *puVar8;
  IntConstOpnd *pIVar9;
  HelperCallOpnd *this_01;
  Instr *instr;
  Func *pFVar10;
  int local_6c;
  JITTypeHolder JStack_68;
  int oldCount;
  JITTypeHolder initialType_local;
  JITTypeHolder finalType_local;
  PropertyIndex local_42;
  Func *pFStack_40;
  PropertyIndex inlineSlotCapacity;
  int local_38;
  PropertyIndex local_32;
  int newCount;
  PropertyIndex newInlineSlotCapacity;
  
  JStack_68.t = initialType.t;
  initialType_local = finalType;
  pJVar5 = JITTypeHolderBase<void>::operator->(&stack0xffffffffffffff98);
  pJVar6 = JITType::GetTypeHandler(pJVar5);
  pJVar5 = JITTypeHolderBase<void>::operator->(&initialType_local);
  pJVar7 = JITType::GetTypeHandler(pJVar5);
  bVar2 = JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(pJVar6,pJVar7);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2049,
                       "(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(initialType->GetTypeHandler(), finalType->GetTypeHandler()))"
                       ,"Incompatible typeHandler transition?");
    if (!bVar2) goto LAB_005d0ac6;
    *puVar8 = 0;
  }
  local_6c = 0;
  local_38 = 0;
  local_42 = 0;
  local_32 = 0;
  pFStack_40 = (Func *)this;
  pJVar5 = JITTypeHolderBase<void>::operator->(&stack0xffffffffffffff98);
  pJVar6 = JITType::GetTypeHandler(pJVar5);
  pJVar5 = JITTypeHolderBase<void>::operator->(&initialType_local);
  pJVar7 = JITType::GetTypeHandler(pJVar5);
  bVar2 = JITTypeHandler::NeedSlotAdjustment(pJVar6,pJVar7,&local_6c,&local_38,&local_42,&local_32);
  pFVar10 = pFStack_40;
  if (bVar2) {
    if (local_38 <= (int)(uint)local_32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x205d,"(newCount > newInlineSlotCapacity)",
                         "newCount > newInlineSlotCapacity");
      if (!bVar3) goto LAB_005d0ac6;
      *puVar8 = 0;
    }
    this_00 = &pFVar10->m_runtimeInfo;
    pIVar9 = IR::IntConstOpnd::New
                       ((long)(int)(local_38 - (uint)local_32),TyInt32,(Func *)pFVar10->m_alloc,
                        false);
    LowererMD::LoadHelperArgument((LowererMD *)this_00,instrInsert,&pIVar9->super_Opnd);
    pIVar9 = IR::IntConstOpnd::New((ulong)local_32,TyUint16,(Func *)pFVar10->m_alloc,false);
    LowererMD::LoadHelperArgument((LowererMD *)this_00,instrInsert,&pIVar9->super_Opnd);
    LowererMD::LoadHelperArgument((LowererMD *)this_00,instrInsert,&baseOpnd->super_Opnd);
    this_01 = IR::HelperCallOpnd::New(HelperAdjustSlots,(Func *)pFVar10->m_alloc);
    instr = IR::Instr::New(Call,(Func *)pFVar10->m_alloc);
    if (instr->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_005d0ac6;
      *puVar8 = 0;
    }
    pFVar10 = instr->m_func;
    if ((this_01->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      pFStack_40 = instr->m_func;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_005d0ac6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
      pFVar10 = pFStack_40;
    }
    bVar4 = (this_01->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar10);
      bVar4 = (this_01->super_Opnd).field_0xb;
    }
    (this_01->super_Opnd).field_0xb = bVar4 | 2;
    instr->m_src1 = &this_01->super_Opnd;
    IR::Instr::InsertBefore(instrInsert,instr);
    LowererMD::LowerCall((LowererMD *)this_00,instr,0);
  }
  return bVar2;
}

Assistant:

bool
Lowerer::GenerateAdjustBaseSlots(IR::Instr *instrInsert, IR::RegOpnd *baseOpnd, JITTypeHolder initialType, JITTypeHolder finalType)
{
    // Possibly allocate new slot capacity to accommodate a type transition.
    AssertMsg(JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(initialType->GetTypeHandler(), finalType->GetTypeHandler()),
        "Incompatible typeHandler transition?");

    int oldCount = 0;
    int newCount = 0;
    Js::PropertyIndex inlineSlotCapacity = 0;
    Js::PropertyIndex newInlineSlotCapacity = 0;
    bool needSlotAdjustment =
        JITTypeHandler::NeedSlotAdjustment(initialType->GetTypeHandler(), finalType->GetTypeHandler(), &oldCount, &newCount, &inlineSlotCapacity, &newInlineSlotCapacity);

    if (!needSlotAdjustment)
    {
        return false;
    }

    // Call AdjustSlots using the new counts. Because AdjustSlots uses the "no dispose" flavor of alloc,
    // no implicit calls are possible, and we don't need an implicit call check and bailout.

    // CALL AdjustSlots, instance, newInlineSlotCapacity, newAuxSlotCapacity

    //3rd Param
    Assert(newCount > newInlineSlotCapacity);
    const int newAuxSlotCapacity = newCount - newInlineSlotCapacity;
    m_lowererMD.LoadHelperArgument(instrInsert, IR::IntConstOpnd::New(newAuxSlotCapacity, TyInt32, this->m_func));

    //2nd Param
    m_lowererMD.LoadHelperArgument(instrInsert, IR::IntConstOpnd::New(newInlineSlotCapacity, TyUint16, this->m_func));

    //1st Param (instance)
    m_lowererMD.LoadHelperArgument(instrInsert, baseOpnd);

    //CALL HelperAdjustSlots
    IR::Opnd *opnd = IR::HelperCallOpnd::New(IR::HelperAdjustSlots, this->m_func);
    IR::Instr *instr = IR::Instr::New(Js::OpCode::Call, this->m_func);
    instr->SetSrc1(opnd);
    instrInsert->InsertBefore(instr);
    m_lowererMD.LowerCall(instr, 0);

    return true;
}